

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O1

void __thiscall
icu_63::number::impl::DecimalQuantity::shiftLeft(DecimalQuantity *this,int32_t numDigits)

{
  int8_t *piVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  
  if ((this->usingBytes == false) && (0x10 < this->precision + numDigits)) {
    switchStorage(this);
  }
  if (this->usingBytes == true) {
    ensureCapacity(this,this->precision + numDigits);
    uVar3 = (this->precision + numDigits) - 1;
    if (0 < this->precision) {
      lVar4 = (long)numDigits;
      lVar5 = (long)(int)uVar3 + 1;
      if (lVar4 < (int)uVar3) {
        uVar3 = numDigits;
      }
      uVar3 = uVar3 - 1;
      do {
        piVar1 = (this->fBCD).bcdBytes.ptr;
        piVar1[lVar5 + -1] = piVar1[(-1 - lVar4) + lVar5];
        lVar5 = lVar5 + -1;
      } while (lVar4 < lVar5);
    }
    if (-1 < (int)uVar3) {
      lVar5 = (ulong)uVar3 + 1;
      do {
        *(undefined1 *)(((this->fBCD).bcdLong - 1) + lVar5) = 0;
        lVar4 = lVar5 + -1;
        bVar2 = 0 < lVar5;
        lVar5 = lVar4;
      } while (lVar4 != 0 && bVar2);
    }
  }
  else {
    (this->fBCD).bcdLong = (this->fBCD).bcdLong << ((char)numDigits * '\x04' & 0x3fU);
  }
  this->scale = this->scale - numDigits;
  this->precision = this->precision + numDigits;
  return;
}

Assistant:

void DecimalQuantity::shiftLeft(int32_t numDigits) {
    if (!usingBytes && precision + numDigits > 16) {
        switchStorage();
    }
    if (usingBytes) {
        ensureCapacity(precision + numDigits);
        int i = precision + numDigits - 1;
        for (; i >= numDigits; i--) {
            fBCD.bcdBytes.ptr[i] = fBCD.bcdBytes.ptr[i - numDigits];
        }
        for (; i >= 0; i--) {
            fBCD.bcdBytes.ptr[i] = 0;
        }
    } else {
        fBCD.bcdLong <<= (numDigits * 4);
    }
    scale -= numDigits;
    precision += numDigits;
}